

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall MeCab::DecoderFeatureIndex::openBinaryModel(DecoderFeatureIndex *this,Param *param)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mmap<char> *this_00;
  char *pcVar6;
  ostream *poVar7;
  long in_RDI;
  string to;
  string modelfile;
  Mmap<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  DecoderFeatureIndex *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar8;
  char *in_stack_ffffffffffffff80;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar9;
  die in_stack_ffffffffffffff8f;
  string local_70 [36];
  undefined4 local_4c;
  byte local_46;
  die local_45 [13];
  string local_38 [55];
  byte local_1;
  
  Param::get<std::__cxx11::string>
            ((Param *)CONCAT17(in_stack_ffffffffffffff8f,
                               CONCAT16(in_stack_ffffffffffffff8e,
                                        CONCAT15(in_stack_ffffffffffffff8d,in_stack_ffffffffffffff88
                                                ))),in_stack_ffffffffffffff80);
  this_00 = (Mmap<char> *)(in_RDI + 0x170);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  local_46 = 0;
  uVar3 = Mmap<char>::open(this_00,pcVar6,0x169cac);
  uVar1 = (undefined1)uVar3;
  if ((uVar3 & 1) == 0) {
    die::die(local_45);
    local_46 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9e);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"mmap_.open(modelfile.c_str())");
    poVar7 = std::operator<<(poVar7,"] ");
    pcVar6 = Mmap<char>::what((Mmap<char> *)0x10e924);
    poVar7 = std::operator<<(poVar7,pcVar6);
    die::operator&(local_45,poVar7);
  }
  if ((local_46 & 1) != 0) {
    die::~die((die *)0x10e979);
  }
  pcVar6 = Mmap<char>::begin((Mmap<char> *)(in_RDI + 0x170));
  Mmap<char>::end(in_stack_fffffffffffffec0);
  iVar4 = (int)pcVar6;
  bVar2 = openFromArray(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  uVar8 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff1c);
  if (bVar2) {
    Param::get<std::__cxx11::string>
              ((Param *)CONCAT17(in_stack_ffffffffffffff8f,
                                 CONCAT16(in_stack_ffffffffffffff8e,
                                          CONCAT15(uVar1,in_stack_ffffffffffffff88))),
               (char *)this_00);
    bVar9 = 0;
    iVar4 = decode_charset((char *)CONCAT44(uVar8,in_stack_ffffffffffffff18));
    std::__cxx11::string::c_str();
    iVar5 = decode_charset((char *)CONCAT44(uVar8,iVar4));
    if (iVar4 != iVar5) {
      die::die((die *)&stack0xffffffffffffff8f);
      bVar9 = 1;
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa5);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"decode_charset(charset_) == decode_charset(to.c_str())");
      poVar7 = std::operator<<(poVar7,"] ");
      poVar7 = std::operator<<(poVar7,"model charset and dictionary charset are different. ");
      poVar7 = std::operator<<(poVar7,"model_charset=");
      poVar7 = std::operator<<(poVar7,*(char **)(in_RDI + 0x370));
      poVar7 = std::operator<<(poVar7," dictionary_charset=");
      poVar7 = std::operator<<(poVar7,local_70);
      die::operator&((die *)&stack0xffffffffffffff8f,poVar7);
    }
    if ((bVar9 & 1) != 0) {
      die::~die((die *)0x10ec10);
    }
    local_1 = 1;
    local_4c = 1;
    std::__cxx11::string::~string(local_70);
  }
  else {
    Mmap<char>::close((Mmap<char> *)(in_RDI + 0x170),iVar4);
    local_1 = 0;
    local_4c = 1;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool DecoderFeatureIndex::openBinaryModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(mmap_.open(modelfile.c_str())) << mmap_.what();
  if (!openFromArray(mmap_.begin(), mmap_.end())) {
    mmap_.close();
    return false;
  }
  const std::string to = param.get<std::string>("charset");
  CHECK_DIE(decode_charset(charset_) ==
            decode_charset(to.c_str()))
      << "model charset and dictionary charset are different. "
      << "model_charset=" << charset_
      << " dictionary_charset=" << to;

  return true;
}